

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void P_PredictPlayer(player_t *player)

{
  byte *pbVar1;
  ticcmd_t *ptVar2;
  double dVar3;
  APlayerPawn *pAVar4;
  msecnode_t *pmVar5;
  AActor *pAVar6;
  FBlockNode *pFVar7;
  ticcmd_t *ptVar8;
  undefined2 uVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  int iVar16;
  bool bVar17;
  bool bVar18;
  FBlockNode *pFVar19;
  int iVar20;
  PredictPos *pPVar21;
  double *pdVar22;
  msecnode_t *pmVar23;
  uint uVar24;
  bool bVar25;
  bool bVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  PredictPos local_b0;
  PredictPos local_70;
  
  iVar16 = maketic;
  if ((((((!cl_noprediction.Value) && (!singletics)) && (!demoplayback)) &&
       ((player->mo != (APlayerPawn *)0x0 &&
        ((player_t *)(&players + (long)consoleplayer * 0x54) == player)))) &&
      ((player->playerstate == '\0' && ((netgame && ((player->cheats & 0x2000) == 0)))))) &&
     (gametic != maketic)) {
    player_t::operator=(&PredictionPlayerBackup,player);
    pAVar4 = player->mo;
    memcpy(PredictionActorBackup,&(pAVar4->super_AActor).snext,0x530);
    pbVar1 = (byte *)((long)&(pAVar4->super_AActor).flags.Value + 1);
    *pbVar1 = *pbVar1 & 0xf7;
    pbVar1 = (byte *)((long)&(pAVar4->super_AActor).flags2.Value + 2);
    *pbVar1 = *pbVar1 & 0xbf;
    pbVar1 = (byte *)((long)&player->cheats + 1);
    *pbVar1 = *pbVar1 | 0x20;
    if (PredictionSector_sprev_Backup.Count != 0) {
      PredictionSector_sprev_Backup.Count = 0;
    }
    pmVar5 = (pAVar4->super_AActor).touching_sectorlist;
    if (PredictionTouchingSectorsBackup.Count != 0) {
      PredictionTouchingSectorsBackup.Count = 0;
    }
    for (; pmVar5 != (msecnode_t *)0x0; pmVar5 = pmVar5->m_tnext) {
      TArray<sector_t_*,_sector_t_*>::Grow(&PredictionTouchingSectorsBackup,1);
      PredictionTouchingSectorsBackup.Array[PredictionTouchingSectorsBackup.Count] =
           pmVar5->m_sector;
      PredictionTouchingSectorsBackup.Count = PredictionTouchingSectorsBackup.Count + 1;
      for (pmVar23 = pmVar5->m_sector->touching_thinglist; pmVar23 != (msecnode_t *)0x0;
          pmVar23 = pmVar23->m_snext) {
        if ((APlayerPawn *)pmVar23->m_thing == pAVar4) {
          TArray<msecnode_t_*,_msecnode_t_*>::Grow(&PredictionSector_sprev_Backup,1);
          PredictionSector_sprev_Backup.Array[PredictionSector_sprev_Backup.Count] =
               pmVar23->m_sprev;
          PredictionSector_sprev_Backup.Count = PredictionSector_sprev_Backup.Count + 1;
          break;
        }
      }
    }
    if (PredictionSectorListBackup.Count != 0) {
      PredictionSectorListBackup.Count = 0;
    }
    if (((pAVar4->super_AActor).flags.Value & 8) == 0) {
      for (pAVar6 = ((pAVar4->super_AActor).Sector)->thinglist; pAVar6 != (AActor *)0x0;
          pAVar6 = pAVar6->snext) {
        TArray<AActor_*,_AActor_*>::Grow(&PredictionSectorListBackup,1);
        PredictionSectorListBackup.Array[PredictionSectorListBackup.Count] = pAVar6;
        PredictionSectorListBackup.Count = PredictionSectorListBackup.Count + 1;
      }
    }
    for (pFVar19 = (pAVar4->super_AActor).BlockNode; pFVar19 != (FBlockNode *)0x0;
        pFVar19 = pFVar19->NextBlock) {
      pFVar7 = pFVar19->NextActor;
      if (pFVar7 != (FBlockNode *)0x0) {
        pFVar7->PrevActor = pFVar19->PrevActor;
      }
      *pFVar19->PrevActor = pFVar7;
    }
    (pAVar4->super_AActor).BlockNode = (FBlockNode *)0x0;
    bVar18 = 0.01 <= cl_predict_lerpscale.Value;
    bVar25 = ticdup == 1;
    bVar17 = R_GetViewInterpolationStatus();
    if (gametic < iVar16) {
      bVar26 = false;
      uVar24 = gametic;
      do {
        if (!bVar17) {
          R_RebuildViewInterpolation(player);
        }
        iVar20 = (int)uVar24 % 0xb4;
        uVar9 = *(undefined2 *)&localcmds[iVar20].field_0x12;
        (player->cmd).consistancy = localcmds[iVar20].consistancy;
        *(undefined2 *)&(player->cmd).field_0x12 = uVar9;
        ptVar2 = localcmds + iVar20;
        sVar10 = (ptVar2->ucmd).pitch;
        sVar11 = (ptVar2->ucmd).yaw;
        ptVar8 = localcmds + iVar20;
        sVar12 = (ptVar8->ucmd).roll;
        sVar13 = (ptVar8->ucmd).forwardmove;
        sVar14 = (ptVar8->ucmd).sidemove;
        sVar15 = (ptVar8->ucmd).upmove;
        (player->cmd).ucmd.buttons = (ptVar2->ucmd).buttons;
        (player->cmd).ucmd.pitch = sVar10;
        (player->cmd).ucmd.yaw = sVar11;
        (player->cmd).ucmd.roll = sVar12;
        (player->cmd).ucmd.forwardmove = sVar13;
        (player->cmd).ucmd.sidemove = sVar14;
        (player->cmd).ucmd.upmove = sVar15;
        P_PlayerThink(player);
        (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[7])();
        if ((uVar24 == _ZL14PredictionLast_0 && 0 < (int)_ZL14PredictionLast_0) &&
            (!bVar17 && (bVar25 && bVar18))) {
          pAVar4 = player->mo;
          dVar3 = (pAVar4->super_AActor).__Pos.X;
          bVar26 = true;
          if ((int)_ZL14PredictionLast_1 == (int)dVar3) {
            bVar26 = (int)_ZL14PredictionLast_2 != (int)(pAVar4->super_AActor).__Pos.Y;
          }
          if ((2 < developer.Value) && (bVar26)) {
            DPrintf(3,"Lerp! Ltic (%d) && Ptic (%d) | Lx (%f) && Px (%f) | Ly (%f) && Py (%f)\n",
                    SUB84(_ZL14PredictionLast_1,0),dVar3,_ZL14PredictionLast_2,
                    (pAVar4->super_AActor).__Pos.Y,(ulong)_ZL14PredictionLast_0,(ulong)uVar24);
          }
        }
        uVar24 = uVar24 + 1;
      } while (iVar16 != uVar24);
    }
    else {
      bVar26 = false;
    }
    if (bVar25 && bVar18) {
      if (bVar17) {
        PredictionLerptics = 0;
        PredictionLerpResult.gametic = 0;
        _ZL18PredictionLerpFrom_0 = 0;
      }
      else if (bVar26) {
        bVar18 = PredictionLerptics == 0;
        pPVar21 = &PredictionLerpResult;
        if (bVar18) {
          pPVar21 = (PredictPos *)&_ZL14PredictionLast_0;
        }
        _ZL18PredictionLerpFrom_0 = pPVar21->gametic;
        pdVar22 = &PredictionLerpResult.pos.Z;
        if (bVar18) {
          pdVar22 = &_ZL14PredictionLast_3;
        }
        _ZL18PredictionLerpFrom_3 = *pdVar22;
        pdVar22 = &PredictionLerpResult.pos.Y;
        if (bVar18) {
          pdVar22 = &_ZL14PredictionLast_2;
        }
        _ZL18PredictionLerpFrom_2 = *pdVar22;
        pdVar22 = &PredictionLerpResult.pos.X;
        if (bVar18) {
          pdVar22 = &_ZL14PredictionLast_1;
        }
        _ZL18PredictionLerpFrom_1 = ((DVector3 *)pdVar22)->X;
        uVar27 = 0;
        uVar28 = 0;
        _ZL18PredictionLerpFrom_6.Degrees = 0.0;
        if (!bVar18) {
          _ZL18PredictionLerpFrom_6.Degrees = PredictionLerpResult.angles.Roll.Degrees;
        }
        _ZL18PredictionLerpFrom_5.Degrees = 0.0;
        if (!bVar18) {
          uVar27 = SUB84(PredictionLerpResult.angles.Pitch.Degrees,0);
          uVar28 = (undefined4)((ulong)PredictionLerpResult.angles.Pitch.Degrees >> 0x20);
          _ZL18PredictionLerpFrom_5.Degrees = PredictionLerpResult.angles.Yaw.Degrees;
        }
        _ZL18PredictionLerpFrom_4 = (double)CONCAT44(uVar28,uVar27);
        PredictionLerptics = 1;
      }
      _ZL14PredictionLast_0 = iVar16 - 1;
      pAVar4 = player->mo;
      _ZL14PredictionLast_1 = (pAVar4->super_AActor).__Pos.X;
      _ZL14PredictionLast_2 = (pAVar4->super_AActor).__Pos.Y;
      _ZL14PredictionLast_3 = (pAVar4->super_AActor).__Pos.Z;
      if (0 < PredictionLerptics) {
        if (0 < _ZL18PredictionLerpFrom_0) {
          local_70.gametic = _ZL18PredictionLerpFrom_0;
          local_70.pos.X = _ZL18PredictionLerpFrom_1;
          local_70.pos.Y = _ZL18PredictionLerpFrom_2;
          local_70.pos.Z = _ZL18PredictionLerpFrom_3;
          local_70.angles.Pitch.Degrees = _ZL18PredictionLerpFrom_4;
          local_70.angles.Yaw.Degrees = _ZL18PredictionLerpFrom_5.Degrees;
          local_70.angles.Roll.Degrees = _ZL18PredictionLerpFrom_6.Degrees;
          local_b0.angles.Pitch.Degrees = 0.0;
          local_b0.angles.Yaw.Degrees = 0.0;
          local_b0.angles.Roll.Degrees = 0.0;
          local_b0.gametic = _ZL14PredictionLast_0;
          local_b0.pos.X = _ZL14PredictionLast_1;
          local_b0.pos.Y = _ZL14PredictionLast_2;
          local_b0.pos.Z = _ZL14PredictionLast_3;
          bVar18 = P_LerpCalculate(&pAVar4->super_AActor,&local_70,&local_b0,&PredictionLerpResult,
                                   (float)PredictionLerptics * cl_predict_lerpscale.Value);
          if (bVar18) {
            PredictionLerptics = PredictionLerptics + 1;
            pAVar4 = player->mo;
            (pAVar4->super_AActor).__Pos.Z = PredictionLerpResult.pos.Z;
            (pAVar4->super_AActor).__Pos.Y = PredictionLerpResult.pos.Y;
            (pAVar4->super_AActor).__Pos.X = PredictionLerpResult.pos.X;
            return;
          }
        }
        PredictionLerptics = 0;
      }
    }
  }
  return;
}

Assistant:

void P_PredictPlayer (player_t *player)
{
	int maxtic;

	if (cl_noprediction ||
		singletics ||
		demoplayback ||
		player->mo == NULL ||
		player != &players[consoleplayer] ||
		player->playerstate != PST_LIVE ||
		!netgame ||
		/*player->morphTics ||*/
		(player->cheats & CF_PREDICTING))
	{
		return;
	}

	maxtic = maketic;

	if (gametic == maxtic)
	{
		return;
	}

	// Save original values for restoration later
	PredictionPlayerBackup = *player;

	APlayerPawn *act = player->mo;
	memcpy(PredictionActorBackup, &act->snext, sizeof(APlayerPawn) - ((BYTE *)&act->snext - (BYTE *)act));

	act->flags &= ~MF_PICKUP;
	act->flags2 &= ~MF2_PUSHWALL;
	player->cheats |= CF_PREDICTING;

	// The ordering of the touching_sectorlist needs to remain unchanged
	// Also store a copy of all previous sector_thinglist nodes
	msecnode_t *mnode = act->touching_sectorlist;
	msecnode_t *snode;
	PredictionSector_sprev_Backup.Clear();
	PredictionTouchingSectorsBackup.Clear ();

	while (mnode != NULL)
	{
		PredictionTouchingSectorsBackup.Push (mnode->m_sector);

		for (snode = mnode->m_sector->touching_thinglist; snode; snode = snode->m_snext)
		{
			if (snode->m_thing == act)
			{
				PredictionSector_sprev_Backup.Push(snode->m_sprev);
				break;
			}
		}

		mnode = mnode->m_tnext;
	}

	// Keep an ordered list off all actors in the linked sector.
	PredictionSectorListBackup.Clear();
	if (!(act->flags & MF_NOSECTOR))
	{
		AActor *link = act->Sector->thinglist;
		
		while (link != NULL)
		{
			PredictionSectorListBackup.Push(link);
			link = link->snext;
		}
	}

	// Blockmap ordering also needs to stay the same, so unlink the block nodes
	// without releasing them. (They will be used again in P_UnpredictPlayer).
	FBlockNode *block = act->BlockNode;

	while (block != NULL)
	{
		if (block->NextActor != NULL)
		{
			block->NextActor->PrevActor = block->PrevActor;
		}
		*(block->PrevActor) = block->NextActor;
		block = block->NextBlock;
	}
	act->BlockNode = NULL;

	// Values too small to be usable for lerping can be considered "off".
	bool CanLerp = (!(cl_predict_lerpscale < 0.01f) && (ticdup == 1)), DoLerp = false, NoInterpolateOld = R_GetViewInterpolationStatus();
	for (int i = gametic; i < maxtic; ++i)
	{
		if (!NoInterpolateOld)
			R_RebuildViewInterpolation(player);

		player->cmd = localcmds[i % LOCALCMDTICS];
		P_PlayerThink (player);
		player->mo->Tick ();

		if (CanLerp && PredictionLast.gametic > 0 && i == PredictionLast.gametic && !NoInterpolateOld)
		{
			// Z is not compared as lifts will alter this with no apparent change
			// Make lerping less picky by only testing whole units
			DoLerp = (int)PredictionLast.pos.X != (int)player->mo->X() || (int)PredictionLast.pos.Y != (int)player->mo->Y();

			// Aditional Debug information
			if (developer >= DMSG_NOTIFY && DoLerp)
			{
				DPrintf(DMSG_NOTIFY, "Lerp! Ltic (%d) && Ptic (%d) | Lx (%f) && Px (%f) | Ly (%f) && Py (%f)\n",
					PredictionLast.gametic, i,
					(PredictionLast.pos.X), (player->mo->X()),
					(PredictionLast.pos.Y), (player->mo->Y()));
			}
		}
	}

	if (CanLerp)
	{
		if (NoInterpolateOld)
			P_PredictionLerpReset();

		else if (DoLerp)
		{
			// If lerping is already in effect, use the previous camera postion so the view doesn't suddenly snap
			PredictionLerpFrom = (PredictionLerptics == 0) ? PredictionLast : PredictionLerpResult;
			PredictionLerptics = 1;
		}

		PredictionLast.gametic = maxtic - 1;
		PredictionLast.pos = player->mo->Pos();
		//PredictionLast.portalgroup = player->mo->Sector->PortalGroup;

		if (PredictionLerptics > 0)
		{
			if (PredictionLerpFrom.gametic > 0 &&
				P_LerpCalculate(player->mo, PredictionLerpFrom, PredictionLast, PredictionLerpResult, (float)PredictionLerptics * cl_predict_lerpscale))
			{
				PredictionLerptics++;
				player->mo->SetXYZ(PredictionLerpResult.pos);
			}
			else
			{
				PredictionLerptics = 0;
			}
		}
	}
}